

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O3

bool __thiscall cmFileLockPool::IsAlreadyLocked(cmFileLockPool *this,string *filename)

{
  pointer ppSVar1;
  pointer ppcVar2;
  bool bVar3;
  cmFileLock **lock;
  pointer ppcVar4;
  List *__range1;
  ScopePool **funcScope;
  pointer ppSVar5;
  pointer ppcVar6;
  
  ppSVar1 = (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar5 = (this->FunctionScopes).
                 super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar5 != ppSVar1;
      ppSVar5 = ppSVar5 + 1) {
    ppcVar2 = ((*ppSVar5)->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar4 = ((*ppSVar5)->Locks).
                   super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppcVar4 != ppcVar2; ppcVar4 = ppcVar4 + 1) {
      bVar3 = cmFileLock::IsLocked(*ppcVar4,filename);
      if (bVar3) {
        return true;
      }
    }
  }
  ppSVar5 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppSVar5 == ppSVar1) {
      ppcVar4 = (this->ProcessScope).Locks.
                super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppcVar2 = (this->ProcessScope).Locks.
                super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppcVar4 == ppcVar2) {
        bVar3 = false;
      }
      else {
        do {
          ppcVar6 = ppcVar4 + 1;
          bVar3 = cmFileLock::IsLocked(*ppcVar4,filename);
          if (bVar3) {
            return bVar3;
          }
          ppcVar4 = ppcVar6;
        } while (ppcVar6 != ppcVar2);
      }
      return bVar3;
    }
    ppcVar2 = ((*ppSVar5)->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar4 = ((*ppSVar5)->Locks).
                   super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppcVar4 != ppcVar2; ppcVar4 = ppcVar4 + 1) {
      bVar3 = cmFileLock::IsLocked(*ppcVar4,filename);
      if (bVar3) {
        return true;
      }
    }
    ppSVar5 = ppSVar5 + 1;
  } while( true );
}

Assistant:

bool cmFileLockPool::IsAlreadyLocked(const std::string& filename) const
{
  for (auto const& funcScope : this->FunctionScopes) {
    const bool result = funcScope->IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  for (auto const& fileScope : this->FileScopes) {
    const bool result = fileScope->IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  return this->ProcessScope.IsAlreadyLocked(filename);
}